

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args;
  SyntaxNode *args_4;
  BinsSelectionSyntax *pBVar1;
  DeepCloneVisitor visitor;
  Token local_68;
  Token local_58;
  Token local_48;
  CoverageIffClauseSyntax *local_38;
  
  args = deepClone<slang::syntax::AttributeInstanceSyntax>
                   ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x18),
                    (BumpAllocator *)__child_stack);
  local_48 = parsing::Token::deepClone((Token *)(__fn + 0x50),(BumpAllocator *)__child_stack);
  local_58 = parsing::Token::deepClone((Token *)(__fn + 0x60),(BumpAllocator *)__child_stack);
  local_68 = parsing::Token::deepClone((Token *)(__fn + 0x70),(BumpAllocator *)__child_stack);
  args_4 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x80),&visitor,(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x88) == (SyntaxNode *)0x0) {
    local_38 = (CoverageIffClauseSyntax *)0x0;
  }
  else {
    local_38 = (CoverageIffClauseSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x88),&visitor,(BumpAllocator *)__child_stack);
  }
  _visitor = parsing::Token::deepClone((Token *)(__fn + 0x90),(BumpAllocator *)__child_stack);
  pBVar1 = BumpAllocator::
           emplace<slang::syntax::BinsSelectionSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::BinsSelectExpressionSyntax&,slang::syntax::CoverageIffClauseSyntax*,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,args,&local_48,&local_58,&local_68,
                      (BinsSelectExpressionSyntax *)args_4,&local_38,(Token *)&visitor);
  return (int)pBVar1;
}

Assistant:

static SyntaxNode* clone(const BinsSelectionSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<BinsSelectionSyntax>(
        *deepClone(node.attributes, alloc),
        node.keyword.deepClone(alloc),
        node.name.deepClone(alloc),
        node.equals.deepClone(alloc),
        *deepClone<BinsSelectExpressionSyntax>(*node.expr, alloc),
        node.iff ? deepClone(*node.iff, alloc) : nullptr,
        node.semi.deepClone(alloc)
    );
}